

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

int __thiscall CTcSymProp::write_to_image_file_global(CTcSymProp *this,CVmImageWriter *image_writer)

{
  tctarg_prop_id_t tVar1;
  char *dat;
  size_t in_RSI;
  CTcSymPropBase *in_RDI;
  undefined1 uVar2;
  char buf [128];
  undefined1 *p;
  int type_id;
  undefined2 in_stack_ffffffffffffff68;
  undefined5 in_stack_ffffffffffffff6b;
  CVmImageWriter *in_stack_ffffffffffffff70;
  
  p = &stack0xffffffffffffff68;
  tVar1 = CTcSymPropBase::get_prop(in_RDI);
  ::oswp2(p,(uint)tVar1);
  type_id = (int)((ulong)p >> 0x20);
  uVar2 = ((byte)in_RDI->field_0x2a >> 1 & 1) != 0;
  dat = CTcSymbolBase::get_sym((CTcSymbolBase *)0x22592b);
  CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x22593a);
  CVmImageWriter::write_gsym_entry
            (in_stack_ffffffffffffff70,
             (char *)CONCAT53(in_stack_ffffffffffffff6b,CONCAT12(uVar2,in_stack_ffffffffffffff68)),
             (size_t)in_RDI,type_id,dat,in_RSI);
  return 1;
}

Assistant:

int CTcSymProp::write_to_image_file_global(class CVmImageWriter *image_writer)
{
    char buf[128];

    /* build our extra data buffer */
    oswp2(buf, (uint)get_prop());

    /* build our flags byte */
    buf[2] = 0;
    if (vocab_)
        buf[2] |= 0x01;

    /* write the data */
    image_writer->write_gsym_entry(get_sym(), get_sym_len(),
                                   (int)TC_SYM_PROP, buf, 3);

    /* we wrote the symbol */
    return TRUE;
}